

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

Point __thiscall
Patch::new_position_for_new_offset
          (Patch *this,uint32_t target_offset,
          function<unsigned_int_(Point)> *old_offset_for_old_position,
          function<Point_(unsigned_int)> *old_position_for_old_offset)

{
  pointer ppNVar1;
  undefined4 uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  Point start;
  uint uVar7;
  char cVar8;
  undefined4 in_register_00000034;
  Patch *this_00;
  Point this_01;
  Point PVar9;
  uint uVar10;
  int iVar11;
  bool bVar12;
  Point node_old_start;
  Point preceding_old_position;
  PositionStackEntry left_ancestor_info;
  Point node_new_start;
  Point preceding_new_position;
  int local_98;
  uint local_94;
  Patch local_90;
  Point local_50;
  Point local_48;
  Point local_40;
  Point local_38;
  
  this_00 = (Patch *)CONCAT44(in_register_00000034,target_offset);
  PVar9 = (Point)this->root;
  local_40 = (Point)old_position_for_old_offset;
  Point::Point((Point *)&local_90.left_ancestor_stack.
                         super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
  Point::Point((Point *)&local_90.left_ancestor_stack.
                         super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_90.change_count = 0;
  local_90.merges_adjacent_changes = false;
  local_90._61_3_ = 0;
  Point::Point(&local_48);
  Point::Point((Point *)&local_90.node_stack.
                         super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  local_94 = 0;
  local_98 = 0;
  local_90.node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)old_offset_for_old_position;
  local_90.left_ancestor_stack.
  super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = target_offset;
  do {
    ppNVar1 = local_90.node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (PVar9 == (Point)0x0) goto LAB_0016c552;
    local_90.node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)Point::traverse((Point *)&local_90.left_ancestor_stack.
                                            super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                                            ._M_impl.super__Vector_impl_data._M_finish,
                                  (Point *)((long)PVar9 + 0x20));
    this_00 = (Patch *)((long)PVar9 + 0x28);
    this_01 = (Point)&local_90.left_ancestor_stack.
                      super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_50 = Point::traverse((Point *)this_01,(Point *)this_00);
    local_90.root =
         (Node *)local_90.node_stack.
                 super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    if (*(long *)((long)ppNVar1 + 0x10) == 0) goto LAB_0016c5b1;
    uVar3 = (**(code **)((long)ppNVar1 + 0x18))((_Any_data *)ppNVar1,(Point *)&local_90);
    old_position_for_old_offset = *(function<Point_(unsigned_int)> **)PVar9;
    local_90.left_ancestor_stack.
    super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    iVar11 = 0;
    if ((Point)old_position_for_old_offset != (Point)0x0) {
      iVar11 = *(int *)((long)old_position_for_old_offset + 0x44);
    }
    uVar6 = local_90.change_count;
    uVar2 = local_90._60_4_;
    if ((Point)old_position_for_old_offset != (Point)0x0) {
      local_90.left_ancestor_stack.
      super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_start._4_4_ =
           *(int *)((long)old_position_for_old_offset + 0x48);
    }
    if (*(Point *)((long)PVar9 + 0x38) == (Point)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = Text::size((Text *)*(Point *)((long)PVar9 + 0x38));
    }
    if (*(Point *)((long)PVar9 + 0x30) == (Point)0x0) {
      uVar5 = ((Point *)((long)PVar9 + 0x40))->row;
    }
    else {
      uVar5 = Text::size((Text *)*(Point *)((long)PVar9 + 0x30));
    }
    target_offset =
         (uint32_t)
         local_90.left_ancestor_stack.
         super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
         _M_impl.super__Vector_impl_data._M_start;
    uVar10 = ((uVar2 + uVar3) - (uVar6 + iVar11)) +
             local_90.left_ancestor_stack.
             super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
             ._M_impl.super__Vector_impl_data._M_start._4_4_;
    uVar7 = uVar4 + uVar10;
    if ((uint32_t)
        local_90.left_ancestor_stack.
        super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
        _M_impl.super__Vector_impl_data._M_start < uVar7) {
      this_00 = (Patch *)(ulong)((uint32_t)
                                 local_90.left_ancestor_stack.
                                 super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_start - uVar10);
      if ((uint32_t)
          local_90.left_ancestor_stack.
          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
          _M_impl.super__Vector_impl_data._M_start < uVar10) {
        bVar12 = *(Point *)PVar9 == (Point)0x0;
        old_position_for_old_offset._1_7_ = 0;
        old_position_for_old_offset._0_1_ = bVar12;
        if (!bVar12) {
          PVar9 = *(Point *)PVar9;
        }
        cVar8 = bVar12 * '\x03';
      }
      else {
        cVar8 = '\x01';
        old_position_for_old_offset._0_4_ = 1;
        old_position_for_old_offset._4_4_ = 0;
        local_90.root =
             (Node *)Text::position_for_offset
                               (*(Text **)((long)PVar9 + 0x38),
                                (uint32_t)
                                local_90.left_ancestor_stack.
                                super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start - uVar10,0,true);
        this_00 = &local_90;
        local_38 = Point::traverse(&local_50,(Point *)this_00);
      }
    }
    else {
      local_98 = uVar5 + uVar3;
      local_90.node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)Point::traverse((Point *)&local_90.node_stack.
                                              super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish,
                                    (Point *)((long)PVar9 + 0x10));
      this_00 = (Patch *)((long)PVar9 + 0x18);
      local_48 = Point::traverse(&local_50,(Point *)this_00);
      local_94 = uVar7;
      if (*(Point *)((long)PVar9 + 8) == (Point)0x0) {
        cVar8 = '\x03';
      }
      else {
        local_90.left_ancestor_stack.
        super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)local_90.node_stack.
                      super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
        if (*(Point *)PVar9 == (Point)0x0) {
          iVar11 = 0;
        }
        else {
          iVar11 = *(int *)((long)*(Point *)PVar9 + 0x44);
        }
        local_90.left_ancestor_stack.
        super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_48;
        if (*(Point *)((long)PVar9 + 0x30) == (Point)0x0) {
          uVar6 = ((Point *)((long)PVar9 + 0x40))->row;
        }
        else {
          uVar6 = Text::size((Text *)*(Point *)((long)PVar9 + 0x30));
        }
        uVar6 = local_90.change_count + uVar6 + iVar11;
        old_position_for_old_offset = *(function<Point_(unsigned_int)> **)PVar9;
        uVar4 = 0;
        iVar11 = 0;
        if ((Point)old_position_for_old_offset != (Point)0x0) {
          iVar11 = *(int *)((long)old_position_for_old_offset + 0x48);
        }
        local_90.change_count = uVar6;
        if (*(Point *)((long)PVar9 + 0x38) != (Point)0x0) {
          uVar4 = Text::size((Text *)*(Point *)((long)PVar9 + 0x38));
        }
        local_90._60_4_ = local_90._60_4_ + uVar4 + iVar11;
        PVar9 = *(Point *)((long)PVar9 + 8);
        cVar8 = '\0';
      }
    }
  } while (cVar8 == '\0');
  if (cVar8 == '\x03') {
LAB_0016c552:
    local_90.root = (Node *)CONCAT44(local_90.root._4_4_,(target_offset - local_94) + local_98);
    this_01 = local_40;
    if (*(Point *)((long)local_40 + 0x10) == (Point)0x0) {
LAB_0016c5b1:
      std::__throw_bad_function_call();
      grab_changes_in_range<Patch::OldCoordinates>
                ((vector<Patch::Change,_std::allocator<Patch::Change>_> *)this_01,this_00,start,
                 (Point)old_position_for_old_offset,false);
      return this_01;
    }
    local_90.node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(*(code *)*(Point *)((long)local_40 + 0x18))(local_40,&local_90);
    local_90.root =
         (Node *)Point::traversal((Point *)&local_90.node_stack.
                                            super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish,
                                  (Point *)&local_90.node_stack.
                                            super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_38 = Point::traverse(&local_48,(Point *)&local_90);
  }
  return local_38;
}

Assistant:

Point Patch::new_position_for_new_offset(uint32_t target_offset,
                                         function<uint32_t(Point)> old_offset_for_old_position,
                                         function<Point(uint32_t)> old_position_for_old_offset) const {
  const Node *node = root;
  Patch::PositionStackEntry left_ancestor_info;
  Point preceding_new_position, preceding_old_position;
  uint32_t preceding_old_offset = 0, preceding_new_offset = 0;

  while (node) {
    Point node_old_start = left_ancestor_info.old_end.traverse(node->old_distance_from_left_ancestor);
    Point node_new_start = left_ancestor_info.new_end.traverse(node->new_distance_from_left_ancestor);
    uint32_t node_old_start_offset = old_offset_for_old_position(node_old_start);
    uint32_t node_new_start_offset = node_old_start_offset -
      left_ancestor_info.total_old_text_size +
      left_ancestor_info.total_new_text_size -
      node->left_subtree_old_text_size() +
      node->left_subtree_new_text_size();
    uint32_t node_new_end_offset = node_new_start_offset + node->new_text_size();
    uint32_t node_old_end_offset = node_old_start_offset + node->old_text_size();

    if (node_new_end_offset <= target_offset) {
      preceding_old_position = node_old_start.traverse(node->old_extent);
      preceding_new_position = node_new_start.traverse(node->new_extent);
      preceding_old_offset = node_old_end_offset;
      preceding_new_offset = node_new_end_offset;
      if (node->right) {
        left_ancestor_info.old_end = preceding_old_position;
        left_ancestor_info.new_end = preceding_new_position;
        left_ancestor_info.total_old_text_size += node->left_subtree_old_text_size() + node->old_text_size();
        left_ancestor_info.total_new_text_size += node->left_subtree_new_text_size() + node->new_text_size();
        node = node->right;
      } else {
        break;
      }
    } else if (node_new_start_offset <= target_offset) {
      return node_new_start
        .traverse(node->new_text->position_for_offset(target_offset - node_new_start_offset));
    } else {
      if (node->left) {
        node = node->left;
      } else {
        break;
      }
    }
  }

  return preceding_new_position.traverse(
    old_position_for_old_offset(
      preceding_old_offset + (target_offset - preceding_new_offset)
    ).traversal(preceding_old_position)
  );
}